

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O2

uint64_t hashmap_murmur(void *data,size_t len,uint64_t seed0,uint64_t seed1)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar18 [16];
  
  uVar3 = (uint)len;
  iVar12 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | len & 0xffffffff) / 0x10);
  lVar9 = (long)iVar12;
  lVar6 = (long)(iVar12 << 4);
  piVar10 = (int *)((long)data + lVar6 + lVar9 * -0x10 + 0xc);
  uVar5 = seed0 & 0xffffffff;
  uVar1 = seed0 & 0xffffffff;
  uVar4 = seed0 & 0xffffffff;
  while( true ) {
    bVar15 = lVar9 == 0;
    lVar9 = lVar9 + -1;
    uVar11 = (uint)uVar4;
    uVar13 = (uint)uVar1;
    uVar14 = (uint)uVar5;
    uVar2 = (uint)seed0;
    if (bVar15) break;
    uVar11 = ((uint)(piVar10[-3] * 0x239b961b) >> 0x11 | piVar10[-3] * -0x34f28000) * -0x54f16877 ^
             uVar11;
    iVar12 = (uVar11 << 0x13 | uVar11 >> 0xd) + uVar13;
    uVar13 = ((uint)(piVar10[-2] * -0x54f16877) >> 0x10 | piVar10[-2] * -0x68770000) * 0x38b34ae5 ^
             uVar13;
    uVar4 = (ulong)(iVar12 * 5 + 0x561ccd1b);
    uVar1 = (ulong)(((uVar13 << 0x11 | uVar13 >> 0xf) + uVar14) * 5 + 0xbcaa747);
    uVar14 = ((uint)(piVar10[-1] * 0x38b34ae5) >> 0xf | piVar10[-1] * -0x6a360000) * -0x5e1c746d ^
             uVar14;
    uVar13 = ((uint)(*piVar10 * -0x5e1c746d) >> 0xe | *piVar10 * 0x2e4c0000) * 0x239b961b ^ uVar2;
    uVar5 = (ulong)(((uVar14 << 0xf | uVar14 >> 0x11) + uVar2) * 5 + 0x96cd1c35);
    seed0 = (uint64_t)
            (((uVar13 << 0xd | uVar13 >> 0x13) + iVar12 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17);
    piVar10 = piVar10 + 4;
  }
  uVar8 = 0;
  uVar7 = 0;
  switch(uVar3 & 0xf) {
  case 0xf:
    uVar7 = (uint)*(byte *)((long)data + lVar6 + 0xe) << 0x10;
  case 0xe:
    uVar7 = uVar7 | (uint)*(byte *)((long)data + lVar6 + 0xd) << 8;
  case 0xd:
    uVar7 = *(byte *)((long)data + lVar6 + 0xc) ^ uVar7;
    uVar2 = uVar2 ^ (uVar7 * -0x5e1c746d >> 0xe | uVar7 * 0x2e4c0000) * 0x239b961b;
  case 0xc:
    uVar7 = (uint)*(byte *)((long)data + lVar6 + 0xb) << 0x18;
  case 0xb:
    uVar7 = uVar7 | (uint)*(byte *)((long)data + lVar6 + 10) << 0x10;
  case 10:
    uVar7 = uVar7 ^ (uint)*(byte *)((long)data + lVar6 + 9) << 8;
  case 9:
    uVar7 = *(byte *)((long)data + lVar6 + 8) ^ uVar7;
    uVar14 = uVar14 ^ (uVar7 * 0x38b34ae5 >> 0xf | uVar7 * -0x6a360000) * -0x5e1c746d;
  case 8:
    uVar7 = (uint)*(byte *)((long)data + lVar6 + 7) << 0x18;
  case 7:
    uVar7 = uVar7 | (uint)*(byte *)((long)data + lVar6 + 6) << 0x10;
  case 6:
    uVar7 = uVar7 ^ (uint)*(byte *)((long)data + lVar6 + 5) << 8;
  case 5:
    uVar7 = *(byte *)((long)data + lVar6 + 4) ^ uVar7;
    uVar13 = uVar13 ^ (uVar7 * -0x54f16877 >> 0x10 | uVar7 * -0x68770000) * 0x38b34ae5;
  case 4:
    uVar7 = (uint)*(byte *)((long)data + lVar6 + 3) << 0x18;
  case 3:
    uVar8 = uVar7 | (uint)*(byte *)((long)data + lVar6 + 2) << 0x10;
  case 2:
    uVar8 = uVar8 ^ (uint)*(byte *)((long)data + lVar6 + 1) << 8;
  case 1:
    uVar8 = *(byte *)((long)data + lVar6) ^ uVar8;
    uVar11 = uVar11 ^ (uVar8 * 0x239b961b >> 0x11 | uVar8 * -0x34f28000) * -0x54f16877;
  case 0:
    uVar11 = (uVar11 ^ uVar3) + (uVar13 ^ uVar3) + (uVar14 ^ uVar3) + (uVar2 ^ uVar3);
    uVar13 = (uVar13 ^ uVar3) + uVar11;
    uVar14 = (uVar14 ^ uVar3) + uVar11;
    uVar3 = (uVar2 ^ uVar3) + uVar11;
    auVar20._12_4_ = uVar3;
    auVar20._8_4_ = uVar14;
    auVar20._4_4_ = uVar11;
    auVar20._0_4_ = uVar13;
    auVar16._0_4_ = uVar13 >> 0x10;
    auVar16._4_4_ = uVar11 >> 0x10;
    auVar16._8_4_ = uVar14 >> 0x10;
    auVar16._12_4_ = uVar3 >> 0x10;
    auVar16 = auVar16 ^ auVar20;
    iVar12 = auVar16._4_4_;
    auVar21._4_4_ = iVar12;
    auVar21._0_4_ = iVar12;
    auVar21._8_4_ = auVar16._12_4_;
    auVar21._12_4_ = auVar16._12_4_;
    auVar17._0_4_ = auVar16._0_4_ * -0x7a143595;
    auVar18._8_4_ = (uint)((auVar16._8_8_ & 0xffffffff) * 0x85ebca6b);
    auVar18._4_4_ = auVar18._8_4_;
    auVar18._0_4_ = auVar17._0_4_;
    uVar3 = (uint)((auVar21._8_8_ & 0xffffffff) * 0x85ebca6b);
    auVar18._12_4_ = uVar3;
    auVar17._8_8_ = auVar18._8_8_;
    auVar17._4_4_ = iVar12 * -0x7a143595;
    auVar19._0_4_ = auVar17._0_4_ >> 0xd;
    auVar19._4_4_ = (uint)(iVar12 * -0x7a143595) >> 0xd;
    auVar19._8_4_ = auVar18._8_4_ >> 0xd;
    auVar19._12_4_ = uVar3 >> 0xd;
    auVar19 = auVar19 ^ auVar17;
    iVar12 = auVar19._4_4_;
    auVar22._4_4_ = iVar12;
    auVar22._0_4_ = iVar12;
    auVar22._8_4_ = auVar19._12_4_;
    auVar22._12_4_ = auVar19._12_4_;
    uVar3 = auVar19._0_4_ * -0x3d4d51cb;
    uVar13 = (uint)((auVar19._8_8_ & 0xffffffff) * 0xc2b2ae35);
    uVar2 = (uint)((auVar22._8_8_ & 0xffffffff) * 0xc2b2ae35);
    uVar3 = uVar3 >> 0x10 ^ uVar3;
    iVar12 = (uVar2 >> 0x10 ^ uVar2) + ((uint)(iVar12 * -0x3d4d51cb) >> 0x10 ^ iVar12 * -0x3d4d51cb)
             + (uVar13 >> 0x10 ^ uVar13) + uVar3;
    return CONCAT44(uVar3 + iVar12,iVar12);
  }
}

Assistant:

uint64_t hashmap_murmur(const void *data, size_t len, uint64_t seed0,
    uint64_t seed1)
{
    (void)seed1;
    return MM86128(data, len, seed0);
}